

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::CLUFactor<double>::solveLleft
          (CLUFactor<double> *this,double eps,double *vec,int *nonz,int rn)

{
  int iVar1;
  pointer pdVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  CLUFactor<double> *pCVar10;
  double dVar11;
  int local_8c;
  int local_88;
  int local_84;
  int *local_80;
  int *local_78;
  double local_70;
  CLUFactor<double> *local_68;
  undefined8 uStack_60;
  int *local_58;
  int *local_50;
  double local_48;
  undefined8 uStack_40;
  
  pdVar2 = (this->l).rval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->l).ridx;
  local_50 = (this->l).rbeg;
  piVar6 = (this->l).rorig;
  local_78 = (this->l).rperm;
  local_8c = 0;
  local_88 = rn;
  local_70 = eps;
  local_68 = this;
  while (local_8c < rn) {
    enQueueMax(nonz,&local_8c,local_78[nonz[local_8c]]);
  }
  local_80 = nonz + local_68->thedim;
  local_84 = 0;
  local_58 = piVar6;
  while (0 < rn) {
    local_8c = deQueueMax(nonz,&local_88);
    iVar5 = piVar6[local_8c];
    pCVar10 = (CLUFactor<double> *)vec[iVar5];
    if (ABS((double)pCVar10) <= local_70) {
      vec[iVar5] = 0.0;
      rn = local_88;
    }
    else {
      local_80[-1] = iVar5;
      local_80 = local_80 + -1;
      dVar11 = -(double)pCVar10;
      lVar4 = (long)local_50[iVar5] << 2;
      uStack_60 = 0;
      uStack_40 = 0x8000000000000000;
      local_68 = pCVar10;
      local_48 = dVar11;
      for (iVar5 = local_50[(long)iVar5 + 1] - local_50[iVar5]; 0 < iVar5; iVar5 = iVar5 + -1) {
        iVar1 = *(int *)((long)piVar3 + lVar4);
        dVar8 = vec[iVar1];
        dVar9 = *(double *)((long)pdVar2 + lVar4 * 2);
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar8 = dVar8 - dVar9 * (double)pCVar10;
          uVar7 = -(ulong)(dVar8 != 0.0);
          vec[iVar1] = (double)(~uVar7 & 0x2b2bff2ee48e0530 | (ulong)dVar8 & uVar7);
        }
        else {
          dVar9 = dVar9 * dVar11;
          if (local_70 < ABS(dVar9)) {
            vec[iVar1] = dVar9;
            enQueueMax(nonz,&local_88,local_78[iVar1]);
            pCVar10 = local_68;
            dVar11 = local_48;
          }
        }
        lVar4 = lVar4 + 4;
      }
      local_84 = local_84 + 1;
      piVar6 = local_58;
      rn = local_88;
    }
  }
  lVar4 = 0;
  iVar5 = 0;
  if (0 < local_84) {
    iVar5 = local_84;
  }
  for (; iVar5 != (int)lVar4; lVar4 = lVar4 + 1) {
    nonz[lVar4] = local_80[lVar4];
  }
  return local_84;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}